

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O1

bool __thiscall cppcms::plugin::scope::is_loaded_by_this_scope(scope *this,string *module)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
          ::find(&(((this->d).ptr_)->objects)._M_t,module);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(((this->d).ptr_)->objects)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool scope::is_loaded_by_this_scope(std::string const &module) const
{
	return d->objects.find(module)!=d->objects.end();
}